

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O1

int CfdGetPrivkeyFromExtkey(void *handle,char *extkey,int network_type,char **privkey,char **wif)

{
  bool bVar1;
  NetType net_type;
  CfdException *pCVar2;
  HDWalletApi api;
  bool is_bitcoin;
  char *work_wif;
  char *work_privkey;
  string key;
  allocator local_ab;
  HDWalletApi local_aa;
  bool local_a9;
  char *local_a8;
  char *local_a0;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  void *local_78;
  string local_70;
  string local_50;
  
  local_a0 = (char *)0x0;
  local_a8 = (char *)0x0;
  local_78 = handle;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(extkey);
  if (bVar1) {
    local_98._0_8_ = "cfdcapi_key.cpp";
    local_98._8_4_ = 0x78b;
    local_88._M_allocated_capacity = 0x5f5475;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"extkey is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98._0_8_ = &local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"Failed to parameter. extkey is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_98);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_a9 = true;
  net_type = cfd::capi::ConvertNetType(network_type,&local_a9);
  if (local_a9 != false) {
    local_98._8_8_ = 0;
    local_88._M_allocated_capacity = local_88._M_allocated_capacity & 0xffffffffffffff00;
    local_98._0_8_ = &local_88;
    if (privkey != (char **)0x0) {
      std::__cxx11::string::string((string *)&local_70,extkey,&local_ab);
      cfd::api::HDWalletApi::GetPrivkeyFromExtkey(&local_50,&local_aa,&local_70,net_type,false,true)
      ;
      std::__cxx11::string::operator=((string *)local_98,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      local_a0 = cfd::capi::CreateString((string *)local_98);
    }
    if (wif != (char **)0x0) {
      std::__cxx11::string::string((string *)&local_70,extkey,&local_ab);
      cfd::api::HDWalletApi::GetPrivkeyFromExtkey(&local_50,&local_aa,&local_70,net_type,true,true);
      std::__cxx11::string::operator=((string *)local_98,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      local_a8 = cfd::capi::CreateString((string *)local_98);
    }
    if (local_a0 != (char *)0x0) {
      *privkey = local_a0;
    }
    if (local_a8 != (char *)0x0) {
      *wif = local_a8;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._0_8_ != &local_88) {
      operator_delete((void *)local_98._0_8_);
    }
    return 0;
  }
  local_98._0_8_ = "cfdcapi_key.cpp";
  local_98._8_4_ = 0x794;
  local_88._M_allocated_capacity = 0x5f5475;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"privkey\'s network_type is invalid."
            );
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_98._0_8_ = &local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"Failed to parameter. privkey\'s network_type is invalid.","");
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_98);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPrivkeyFromExtkey(
    void* handle, const char* extkey, int network_type, char** privkey,
    char** wif) {
  char* work_privkey = nullptr;
  char* work_wif = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(extkey)) {
      warn(CFD_LOG_SOURCE, "extkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. extkey is null or empty.");
    }

    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }
    HDWalletApi api;
    std::string key;
    if (privkey != nullptr) {
      key = api.GetPrivkeyFromExtkey(extkey, net_type, false);
      work_privkey = CreateString(key);
    }
    if (wif != nullptr) {
      key = api.GetPrivkeyFromExtkey(extkey, net_type, true);
      work_wif = CreateString(key);
    }

    if (work_privkey != nullptr) *privkey = work_privkey;
    if (work_wif != nullptr) *wif = work_wif;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(&work_privkey, &work_wif);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(&work_privkey, &work_wif);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(&work_privkey, &work_wif);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}